

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

UnitySource * __thiscall
cmLocalGenerator::WriteUnitySource
          (UnitySource *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
                   sources,cmValue beforeInclude,cmValue afterInclude,string *filename)

{
  bool bVar1;
  Encoding encoding;
  cmGlobalGenerator *pcVar2;
  size_type sVar3;
  size_type sVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  reference puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  const_reference s;
  string *sf_full_path;
  string_view sVar6;
  string local_490;
  string *local_470;
  string *local_468;
  string *local_460;
  string_view local_458;
  string local_448;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_428;
  size_t sStack_420;
  cmAlphaNum local_410;
  cmAlphaNum local_3e0;
  string local_3b0;
  unsigned_long local_390;
  size_t ci;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  string_view sep;
  undefined1 local_340 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> cond;
  UnityBatchedSource *ubs;
  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  __end1;
  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  *__range1;
  undefined1 local_2f0 [7];
  bool perConfig;
  cmGeneratedFileStream file;
  allocator<char> local_71;
  string local_70;
  cmValue local_50;
  cmValue uniqueIdName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  cmValue afterInclude_local;
  cmValue beforeInclude_local;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  sources_local;
  
  beforeInclude_local.Value = (string *)sources.Begin._M_current;
  uniqueIdName.Value = (string *)configs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"UNITY_BUILD_UNIQUE_ID",&local_71);
  local_50 = cmGeneratorTarget::GetProperty(target,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pcVar2 = cmGeneratorTarget::GetGlobalGenerator(target);
  encoding = (*pcVar2->_vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2f0,filename,false,encoding);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2f0,true);
  std::operator<<((ostream *)local_2f0,"/* generated by CMake */\n\n");
  __range1._7_1_ = false;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
           ::begin((cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
                    *)&beforeInclude_local);
  ubs = (UnityBatchedSource *)
        cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
        ::end((cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
               *)&beforeInclude_local);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
                                *)&ubs);
    if (!bVar1) break;
    cond.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._32_8_ = __gnu_cxx::
              __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
              ::operator*(&__end1);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_340);
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       (cond.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._32_8_ + 8));
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)uniqueIdName.Value);
    if (sVar3 != sVar4) {
      __range1._7_1_ = true;
      std::__cxx11::string::string((string *)&sep._M_str);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)local_340,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sep._M_str);
      std::__cxx11::string::~string((string *)&sep._M_str);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range3);
      this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (cond.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._32_8_ + 8);
      __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
      ci = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)&ci);
        if (!bVar1) break;
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end3);
        local_390 = *puVar5;
        str = std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_340);
        cmAlphaNum::cmAlphaNum(&local_3e0,str);
        local_428 = __range3;
        sStack_420 = sep._M_len;
        sVar6._M_str = (char *)sep._M_len;
        sVar6._M_len = (size_t)__range3;
        cmAlphaNum::cmAlphaNum(&local_410,sVar6);
        s = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)uniqueIdName.Value,local_390);
        cmsys::SystemTools::UpperCase(&local_448,s);
        cmStrCat<char[28],std::__cxx11::string,char[2]>
                  (&local_3b0,&local_3e0,&local_410,(char (*) [28])"defined(CMAKE_UNITY_CONFIG_",
                   &local_448,(char (*) [2])0xc8f45a);
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)local_340,&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_448);
        sVar6 = (string_view)::cm::operator____s(" || ",4);
        sep._M_len = (size_t)sVar6._M_str;
        __range3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)sVar6._M_len;
        local_458 = sVar6;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end3);
      }
    }
    anon_unknown.dwarf_34f833::RegisterUnitySources
              (target,*(cmSourceFile **)
                       cond.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._32_8_,filename);
    sf_full_path = cmSourceFile::ResolveFullPath
                             (*(cmSourceFile **)
                               cond.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._32_8_,(string *)0x0,(string *)0x0);
    local_460 = beforeInclude.Value;
    local_468 = afterInclude.Value;
    local_470 = local_50.Value;
    WriteUnitySourceInclude
              (this,(ostream *)local_2f0,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_340,sf_full_path,beforeInclude,afterInclude,local_50);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_340);
    __gnu_cxx::
    __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::string((string *)&local_490,(string *)filename);
  UnitySource::UnitySource(__return_storage_ptr__,&local_490,__range1._7_1_);
  std::__cxx11::string::~string((string *)&local_490);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2f0);
  return __return_storage_ptr__;
}

Assistant:

cmLocalGenerator::UnitySource cmLocalGenerator::WriteUnitySource(
  cmGeneratorTarget* target, std::vector<std::string> const& configs,
  cmRange<std::vector<UnityBatchedSource>::const_iterator> sources,
  cmValue beforeInclude, cmValue afterInclude, std::string filename) const
{
  cmValue uniqueIdName = target->GetProperty("UNITY_BUILD_UNIQUE_ID");
  cmGeneratedFileStream file(
    filename, false, target->GetGlobalGenerator()->GetMakefileEncoding());
  file.SetCopyIfDifferent(true);
  file << "/* generated by CMake */\n\n";

  bool perConfig = false;
  for (UnityBatchedSource const& ubs : sources) {
    cm::optional<std::string> cond;
    if (ubs.Configs.size() != configs.size()) {
      perConfig = true;
      cond = std::string();
      cm::string_view sep;
      for (size_t ci : ubs.Configs) {
        cond = cmStrCat(*cond, sep, "defined(CMAKE_UNITY_CONFIG_",
                        cmSystemTools::UpperCase(configs[ci]), ")");
        sep = " || "_s;
      }
    }
    RegisterUnitySources(target, ubs.Source, filename);
    WriteUnitySourceInclude(file, cond, ubs.Source->ResolveFullPath(),
                            beforeInclude, afterInclude, uniqueIdName);
  }

  return UnitySource(std::move(filename), perConfig);
}